

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O2

ntuple_list
LineSegmentDetection
          (image_double image,double scale,double sigma_scale,double quant,double ang_th,double eps,
          double density_th,int n_bins,double max_grad,image_int *region)

{
  undefined1 auVar1 [16];
  image_int *ppiVar2;
  uint uVar3;
  image_double piVar4;
  image_double i;
  image_int piVar5;
  image_char i_00;
  point *reg;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined8 in_XMM1_Qb;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  undefined8 uVar36;
  int reg_size;
  undefined1 local_248 [16];
  double local_230;
  image_double local_228;
  double local_220;
  double local_218;
  uint local_210;
  uint local_20c;
  double local_208;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  undefined1 local_198 [16];
  double local_188;
  double dStack_180;
  undefined1 local_178 [16];
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  image_double local_108;
  image_double local_100;
  coorlist *list_p;
  image_double modgrad;
  double local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  uint local_c4;
  int local_c0;
  int local_bc;
  uint local_b8;
  undefined4 uStack_b4;
  double dStack_b0;
  ntuple_list local_a8;
  image_int *local_a0;
  double local_98;
  ulong local_90;
  double reg_angle;
  void *mem_p;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_220 = ang_th;
  local_138 = scale;
  local_128 = eps;
  local_118 = quant;
  local_110 = density_th;
  local_e8 = max_grad;
  local_248._0_8_ = sigma_scale;
  local_248._8_8_ = in_XMM1_Qb;
  local_a8 = new_ntuple_list(5);
  if ((((image == (image_double)0x0) || (image->data == (double *)0x0)) || (image->xsize == 0)) ||
     (image->ysize == 0)) {
    error("invalid image input.");
  }
  if (local_138 <= 0.0) {
    error("\'scale\' value must be positive.");
  }
  if ((double)local_248._0_8_ <= 0.0) {
    error("\'sigma_scale\' value must be positive.");
  }
  if (local_118 < 0.0) {
    error("\'quant\' value must be positive.");
  }
  if ((local_220 <= 0.0) || (180.0 <= local_220)) {
    error("\'ang_th\' value must be in the range (0,180).");
  }
  if ((local_110 < 0.0) || (1.0 < local_110)) {
    error("\'density_th\' value must be in the range [0,1].");
  }
  if (n_bins < 1) {
    error("\'n_bins\' value must be positive.");
  }
  if (local_e8 <= 0.0) {
    error("\'max_grad\' value must be positive.");
  }
  local_230 = (local_220 * 3.141592653589793) / 180.0;
  dVar26 = sin(local_230);
  dVar26 = local_118 / dVar26;
  local_a0 = region;
  if ((local_138 != 1.0) || (NAN(local_138))) {
    if ((image->data == (double *)0x0) ||
       ((image->xsize == 0 || (uVar3 = image->ysize, uVar3 == 0)))) {
      error("gaussian_sampler: invalid image.");
    }
    dVar27 = (double)image->xsize * local_138;
    local_118 = dVar26;
    local_c4 = n_bins;
    if ((4294967295.0 < dVar27) || (local_208 = (double)uVar3 * local_138, 4294967295.0 < local_208)
       ) {
      error("gaussian_sampler: the output image size exceeds the handled size.");
    }
    dVar26 = floor(dVar27);
    dVar27 = floor(local_208);
    piVar4 = new_image_double((uint)(long)dVar26,uVar3);
    local_108 = new_image_double((uint)(long)dVar26,(uint)(long)dVar27);
    local_48 = (double)(~-(ulong)(local_138 < 1.0) & local_248._0_8_ |
                       (ulong)((double)local_248._0_8_ / local_138) & -(ulong)(local_138 < 1.0));
    uStack_40 = local_248._8_8_;
    dVar26 = ceil(local_48 * 3.7169221888498387);
    uVar14 = (ulong)dVar26;
    iVar18 = (int)uVar14;
    local_248._0_8_ = new_ntuple_list(iVar18 * 2 + 1);
    uVar3 = image->xsize;
    local_218 = (double)(ulong)uVar3;
    local_208 = (double)(ulong)image->ysize;
    iVar13 = uVar3 * 2;
    local_98 = (double)(uVar14 & 0xffffffff);
    local_b8 = iVar13 + (uint)(iVar13 == 0);
    local_20c = piVar4->xsize;
    dVar26 = (double)(ulong)(uint)-iVar18;
    local_78 = (double)CONCAT44(local_78._4_4_,iVar18 + -1);
    dVar27 = 0.0;
    uVar21 = 0;
    local_228 = image;
    local_100 = piVar4;
    local_90 = uVar14;
    local_68 = dVar26;
    while (uVar14 = uVar21, uVar20 = (uint)uVar14, uVar20 != local_20c) {
      local_120 = dVar27 / local_138;
      local_50 = dVar27;
      dVar27 = floor(local_120 + 0.5);
      uVar23 = (uint)dVar27;
      gaussian_kernel((ntuple_list)local_248._0_8_,local_48,
                      (local_120 + local_98) - (double)(int)dVar27);
      local_d8 = (ulong)local_100->ysize;
      local_bc = uVar23 - (int)local_90;
      local_c0 = (int)local_90 - uVar23;
      for (uVar21 = 0; uVar21 != local_d8; uVar21 = uVar21 + 1) {
        local_d0 = (ulong)*(uint *)(local_248._0_8_ + 8);
        dVar27 = 0.0;
        uVar17 = 0;
        uVar15 = uVar23;
        iVar18 = local_c0;
        iVar24 = local_bc;
        while( true ) {
          iVar8 = 0;
          if (0 < iVar24) {
            iVar8 = iVar24;
          }
          if (uVar17 == local_d0) break;
          iVar11 = 0;
          if (0 < iVar24) {
            iVar11 = iVar24;
          }
          uVar10 = (uint)(iVar11 + iVar18 != 0);
          uVar7 = (iVar8 + iVar18) - uVar10;
          local_120 = (double)CONCAT44(local_120._4_4_,uVar15);
          uVar22 = uVar15;
          do {
            uVar22 = uVar22 + uVar3 * -2;
          } while (iVar13 <= (int)(((uVar7 / local_b8 + uVar10) * 2 + 2) * local_218._0_4_ +
                                   SUB84(dVar26,0) + uVar22));
          iVar11 = SUB84(local_68,0) + uVar22;
          iVar8 = ((uVar7 / local_b8 + uVar10) * 2 + 2) * local_218._0_4_ + iVar11;
          if ((int)local_228->xsize <=
              (int)(((uVar7 / local_b8 + uVar10) * 2 + 2) * local_218._0_4_ + iVar11)) {
            iVar8 = (local_78._0_4_ - (uVar7 / local_b8 + uVar10) * iVar13) - uVar22;
          }
          dVar27 = dVar27 + local_228->data[local_228->xsize * (int)uVar21 + iVar8] *
                            (*(double **)(local_248._0_8_ + 0x10))[uVar17];
          uVar17 = uVar17 + 1;
          iVar24 = iVar24 + 1;
          iVar18 = iVar18 + -1;
          uVar15 = uVar15 + 1;
          dVar26 = local_68;
        }
        local_100->data[local_20c * (int)uVar21 + uVar20] = dVar27;
      }
      dVar27 = local_50 + 1.0;
      local_210 = uVar23;
      local_e0 = uVar14;
      uVar21 = (ulong)(uVar20 + 1);
    }
    iVar18 = SUB84(local_208,0);
    iVar13 = iVar18 * 2;
    local_210 = local_108->ysize;
    uVar20 = iVar13 + (uint)(iVar13 == 0);
    for (uVar3 = 0; uVar21 = (ulong)uVar3, uVar3 != local_210; uVar3 = uVar3 + 1) {
      local_218 = (double)uVar21 / local_138;
      dVar27 = floor(local_218 + 0.5);
      uVar15 = (uint)dVar27;
      gaussian_kernel((ntuple_list)local_248._0_8_,local_48,
                      (local_218 + local_98) - (double)(int)dVar27);
      local_218 = (double)(ulong)local_108->xsize;
      uVar23 = local_108->xsize * uVar3;
      local_120 = (double)(ulong)uVar23;
      iVar8 = uVar15 - (int)local_90;
      local_d0 = CONCAT44(local_d0._4_4_,iVar8);
      iVar24 = (int)local_90 - uVar15;
      local_d8 = CONCAT44(local_d8._4_4_,iVar24);
      for (dVar27 = 0.0; dVar27 != local_218; dVar27 = (double)((long)dVar27 + 1)) {
        dVar28 = 0.0;
        uVar14 = 0;
        uVar22 = uVar15;
        iVar11 = iVar24;
        iVar19 = iVar8;
        while( true ) {
          iVar9 = 0;
          if (0 < iVar19) {
            iVar9 = iVar19;
          }
          if (uVar14 == *(uint *)(local_248._0_8_ + 8)) break;
          iVar12 = 0;
          if (0 < iVar19) {
            iVar12 = iVar19;
          }
          uVar16 = (uint)(iVar12 + iVar11 != 0);
          uVar10 = (iVar9 + iVar11) - uVar16;
          uVar7 = uVar22;
          do {
            uVar7 = uVar7 + iVar18 * -2;
          } while (iVar13 <= (int)(((uVar10 / uVar20 + uVar16) * 2 + 2) * local_208._0_4_ +
                                   SUB84(dVar26,0) + uVar7));
          iVar12 = SUB84(local_68,0) + uVar7;
          iVar9 = ((uVar10 / uVar20 + uVar16) * 2 + 2) * local_208._0_4_ + iVar12;
          if ((int)local_228->ysize <=
              (int)(((uVar10 / uVar20 + uVar16) * 2 + 2) * local_208._0_4_ + iVar12)) {
            iVar9 = (local_78._0_4_ - (uVar10 / uVar20 + uVar16) * iVar13) - uVar7;
          }
          dVar28 = dVar28 + local_100->data[iVar9 * local_20c + SUB84(dVar27,0)] *
                            (*(double **)(local_248._0_8_ + 0x10))[uVar14];
          uVar14 = uVar14 + 1;
          iVar19 = iVar19 + 1;
          iVar11 = iVar11 + -1;
          uVar22 = uVar22 + 1;
          dVar26 = local_68;
        }
        local_108->data[uVar23 + SUB84(dVar27,0)] = dVar28;
      }
      local_e0 = uVar21;
      local_b8 = uVar15;
    }
    free_ntuple_list((ntuple_list)local_248._0_8_);
    free_image_double(local_100);
    piVar4 = local_108;
    i = ll_angle(local_108,local_118,&list_p,&mem_p,&modgrad,local_c4,local_e8);
    free_image_double(piVar4);
  }
  else {
    i = ll_angle(image,dVar26,&list_p,&mem_p,&modgrad,n_bins,local_e8);
  }
  local_220 = local_220 / 180.0;
  uVar3 = i->xsize;
  uVar20 = i->ysize;
  local_208 = log10((double)uVar3);
  local_228 = (image_double)log10((double)uVar20);
  local_248._0_8_ = log10(local_220);
  ppiVar2 = local_a0;
  if (local_a0 != (image_int *)0x0) {
    piVar5 = new_image_int_ini(i->xsize,i->ysize,0);
    *ppiVar2 = piVar5;
  }
  iVar18 = 0;
  i_00 = new_image_char_ini(uVar3,uVar20,'\0');
  reg = (point *)calloc((ulong)(uVar20 * uVar3),8);
  if (reg == (point *)0x0) {
    error("not enough memory!");
  }
  local_208 = (local_208 + (double)local_228) * 5.0 * 0.5;
  iVar13 = (int)(-local_208 / (double)local_248._0_8_);
  local_b8 = SUB84(local_138,0);
  uStack_b4 = (undefined4)((ulong)local_138 >> 0x20);
  dStack_b0 = local_138;
  local_228 = (image_double)CONCAT44(local_228._4_4_,iVar13);
  dVar26 = local_230;
  do {
    if (list_p == (coorlist *)0x0) {
      free_image_double(i);
      free_image_double(modgrad);
      free_image_char(i_00);
      free(reg);
      free(mem_p);
      return local_a8;
    }
    iVar24 = list_p->x;
    iVar8 = list_p->y;
    if ((i_00->data[i_00->xsize * iVar8 + iVar24] == '\0') &&
       (((i->data[i->xsize * iVar8 + iVar24] != -1024.0 || (NAN(i->data[i->xsize * iVar8 + iVar24]))
         ) && (region_grow(iVar24,iVar8,i,reg,&reg_size,&reg_angle,i_00,dVar26), dVar26 = local_230,
              iVar13 <= reg_size)))) {
      region2rect(reg,reg_size,modgrad,reg_angle,local_230,local_220,(rect *)local_1f8);
      piVar4 = modgrad;
      local_198._0_8_ = reg_angle;
      if (local_230 < 0.0) {
        error("refine: \'prec\' must be positive.");
      }
      if (i_00->data == (uchar *)0x0) {
        error("refine: invalid image \'used\'.");
      }
      uVar36 = 0;
      if (i->data == (double *)0x0) {
        error("refine: invalid image \'angles\'.");
      }
      if (local_110 <=
          (double)reg_size /
          (SQRT(((double)local_1e8._0_8_ - (double)local_1f8._0_8_) *
                ((double)local_1e8._0_8_ - (double)local_1f8._0_8_) +
                ((double)local_1e8._8_8_ - (double)local_1f8._8_8_) *
                ((double)local_1e8._8_8_ - (double)local_1f8._8_8_)) * local_1d8)) {
LAB_001045e3:
        dVar26 = rect_nfa((rect *)local_1f8,i,local_208);
        local_248._0_8_ = dVar26;
        if (dVar26 <= local_128) {
          local_178._8_8_ = dStack_1d0;
          local_178._0_8_ = local_1d8;
          local_198 = local_1f8;
          local_188 = (double)local_1e8._0_8_;
          dStack_180 = (double)local_1e8._8_8_;
          local_168 = local_1c8;
          dStack_160 = dStack_1c0;
          local_158 = local_1b8;
          dStack_150 = dStack_1b0;
          dStack_140 = dStack_1a0;
          iVar13 = 5;
          while (bVar25 = iVar13 != 0, iVar13 = iVar13 + -1, bVar25) {
            dStack_140 = dStack_140 * 0.5;
            local_148 = dStack_140 * 3.141592653589793;
            dVar26 = rect_nfa((rect *)local_198,i,local_208);
            if ((double)local_248._0_8_ < dVar26) {
              local_1e8._8_8_ = dStack_180;
              local_1e8._0_8_ = local_188;
              local_1d8 = (double)local_178._0_8_;
              dStack_1d0 = (double)local_178._8_8_;
              local_1c8 = local_168;
              dStack_1c0 = dStack_160;
              local_1f8 = local_198;
              local_1b8 = local_158;
              dStack_1b0 = dStack_150;
              local_1a8 = local_148;
              dStack_1a0 = dStack_140;
              local_248._0_8_ = dVar26;
            }
          }
          if ((double)local_248._0_8_ <= local_128) {
            local_178._8_8_ = dStack_1d0;
            local_178._0_8_ = local_1d8;
            local_198 = local_1f8;
            local_188 = (double)local_1e8._0_8_;
            dStack_180 = (double)local_1e8._8_8_;
            local_168 = local_1c8;
            dStack_160 = dStack_1c0;
            local_158 = local_1b8;
            dStack_150 = dStack_1b0;
            local_148 = local_1a8;
            dStack_140 = dStack_1a0;
            iVar13 = 5;
            while (bVar25 = iVar13 != 0, iVar13 = iVar13 + -1, bVar25) {
              if (0.5 <= (double)local_178._0_8_ + -0.5) {
                local_178._0_8_ = (double)local_178._0_8_ + -0.5;
                dVar26 = rect_nfa((rect *)local_198,i,local_208);
                if ((double)local_248._0_8_ < dVar26) {
                  local_1e8._8_8_ = dStack_180;
                  local_1e8._0_8_ = local_188;
                  local_1d8 = (double)local_178._0_8_;
                  dStack_1d0 = (double)local_178._8_8_;
                  local_1c8 = local_168;
                  dStack_1c0 = dStack_160;
                  local_1f8 = local_198;
                  local_1b8 = local_158;
                  dStack_1b0 = dStack_150;
                  local_1a8 = local_148;
                  dStack_1a0 = dStack_140;
                  local_248._0_8_ = dVar26;
                }
              }
            }
            if ((double)local_248._0_8_ <= local_128) {
              local_178._8_8_ = dStack_1d0;
              local_178._0_8_ = local_1d8;
              local_198 = local_1f8;
              local_188 = (double)local_1e8._0_8_;
              dStack_180 = (double)local_1e8._8_8_;
              local_168 = local_1c8;
              dStack_160 = dStack_1c0;
              local_158 = local_1b8;
              dStack_150 = dStack_1b0;
              local_148 = local_1a8;
              dStack_140 = dStack_1a0;
              iVar13 = 5;
              while( true ) {
                bVar25 = iVar13 == 0;
                iVar13 = iVar13 + -1;
                if (bVar25) break;
                if (0.5 <= (double)local_178._0_8_ + -0.5) {
                  local_198._0_8_ = (double)local_198._0_8_ + -dStack_150 * 0.25;
                  local_198._8_8_ = (double)local_198._8_8_ + local_158 * 0.25;
                  local_188 = -dStack_150 * 0.25 + local_188;
                  dStack_180 = local_158 * 0.25 + dStack_180;
                  local_178._0_8_ = (double)local_178._0_8_ + -0.5;
                  dVar26 = rect_nfa((rect *)local_198,i,local_208);
                  if ((double)local_248._0_8_ < dVar26) {
                    local_1e8._8_8_ = dStack_180;
                    local_1e8._0_8_ = local_188;
                    local_1d8 = (double)local_178._0_8_;
                    dStack_1d0 = (double)local_178._8_8_;
                    local_1c8 = local_168;
                    dStack_1c0 = dStack_160;
                    local_1f8 = local_198;
                    local_1b8 = local_158;
                    dStack_1b0 = dStack_150;
                    local_1a8 = local_148;
                    dStack_1a0 = dStack_140;
                    local_248._0_8_ = dVar26;
                  }
                }
              }
              if ((double)local_248._0_8_ <= local_128) {
                local_178._8_8_ = dStack_1d0;
                local_178._0_8_ = local_1d8;
                local_198 = local_1f8;
                local_188 = (double)local_1e8._0_8_;
                dStack_180 = (double)local_1e8._8_8_;
                local_168 = local_1c8;
                dStack_160 = dStack_1c0;
                local_158 = local_1b8;
                dStack_150 = dStack_1b0;
                local_148 = local_1a8;
                dStack_140 = dStack_1a0;
                iVar13 = 5;
                while( true ) {
                  bVar25 = iVar13 == 0;
                  iVar13 = iVar13 + -1;
                  if (bVar25) break;
                  if (0.5 <= (double)local_178._0_8_ + -0.5) {
                    local_198._0_8_ = (double)local_198._0_8_ + dStack_150 * 0.25;
                    local_198._8_8_ = (double)local_198._8_8_ + -local_158 * 0.25;
                    local_188 = dStack_150 * 0.25 + local_188;
                    dStack_180 = -local_158 * 0.25 + dStack_180;
                    local_178._0_8_ = (double)local_178._0_8_ + -0.5;
                    dVar26 = rect_nfa((rect *)local_198,i,local_208);
                    if ((double)local_248._0_8_ < dVar26) {
                      local_1e8._8_8_ = dStack_180;
                      local_1e8._0_8_ = local_188;
                      local_1d8 = (double)local_178._0_8_;
                      dStack_1d0 = (double)local_178._8_8_;
                      local_1c8 = local_168;
                      dStack_1c0 = dStack_160;
                      local_1f8 = local_198;
                      local_1b8 = local_158;
                      dStack_1b0 = dStack_150;
                      local_1a8 = local_148;
                      dStack_1a0 = dStack_140;
                      local_248._0_8_ = dVar26;
                    }
                  }
                }
                if ((double)local_248._0_8_ <= local_128) {
                  local_178._8_8_ = dStack_1d0;
                  local_178._0_8_ = local_1d8;
                  local_198 = local_1f8;
                  local_188 = (double)local_1e8._0_8_;
                  dStack_180 = (double)local_1e8._8_8_;
                  local_168 = local_1c8;
                  dStack_160 = dStack_1c0;
                  local_158 = local_1b8;
                  dStack_150 = dStack_1b0;
                  dStack_140 = dStack_1a0;
                  iVar13 = 5;
                  while (bVar25 = iVar13 != 0, iVar13 = iVar13 + -1, bVar25) {
                    dStack_140 = dStack_140 * 0.5;
                    local_148 = dStack_140 * 3.141592653589793;
                    dVar26 = rect_nfa((rect *)local_198,i,local_208);
                    if ((double)local_248._0_8_ < dVar26) {
                      local_1e8._8_8_ = dStack_180;
                      local_1e8._0_8_ = local_188;
                      local_1f8 = local_198;
                      local_1d8 = (double)local_178._0_8_;
                      dStack_1d0 = (double)local_178._8_8_;
                      local_1c8 = local_168;
                      dStack_1c0 = dStack_160;
                      local_1b8 = local_158;
                      dStack_1b0 = dStack_150;
                      local_1a8 = local_148;
                      dStack_1a0 = dStack_140;
                      local_248._0_8_ = dVar26;
                    }
                  }
                }
              }
            }
          }
        }
        ppiVar2 = local_a0;
        if (local_128 < (double)local_248._0_8_) {
          local_1e8._0_8_ = (double)local_1e8._0_8_ + 0.5;
          local_1e8._8_8_ = (double)local_1e8._8_8_ + 0.5;
          local_1f8._0_8_ = (double)local_1f8._0_8_ + 0.5;
          local_1f8._8_8_ = (double)local_1f8._8_8_ + 0.5;
          if ((local_138 != 1.0) || (NAN(local_138))) {
            auVar1._4_4_ = uStack_b4;
            auVar1._0_4_ = local_b8;
            auVar1._8_8_ = dStack_b0;
            local_1e8 = divpd(local_1e8,auVar1);
            local_1f8 = divpd(local_1f8,auVar1);
            local_1d8 = local_1d8 / local_138;
          }
          iVar18 = iVar18 + 1;
          add_5tuple(local_a8,local_1f8._0_8_,local_1f8._8_8_,local_1e8._0_8_,local_1e8._8_8_,
                     local_1d8);
          if (ppiVar2 != (image_int *)0x0) {
            for (lVar6 = 0; lVar6 < reg_size; lVar6 = lVar6 + 1) {
              piVar5 = *ppiVar2;
              piVar5->data[piVar5->xsize * reg[lVar6].y + reg[lVar6].x] = iVar18;
            }
          }
        }
      }
      else {
        iVar13 = reg->x;
        iVar24 = reg->y;
        dVar26 = i->data[iVar24 * i->xsize + iVar13];
        lVar6 = 0;
        auVar30 = ZEXT816(0);
        dVar27 = 0.0;
        iVar8 = 0;
        while( true ) {
          dVar28 = auVar30._0_8_;
          if (reg_size <= lVar6) break;
          i_00->data[i_00->xsize * reg[lVar6].y + reg[lVar6].x] = '\0';
          dVar34 = (double)reg[lVar6].x - (double)iVar13;
          dVar35 = (double)reg[lVar6].y - (double)iVar24;
          if (SQRT(dVar34 * dVar34 + dVar35 * dVar35) < local_1d8) {
            for (dVar34 = i->data[reg[lVar6].y * i->xsize + reg[lVar6].x] - dVar26;
                dVar34 <= -3.141592653589793; dVar34 = dVar34 + 6.28318530718) {
            }
            for (; 3.141592653589793 < dVar34; dVar34 = dVar34 + -6.28318530718) {
            }
            auVar30._0_8_ = dVar28 + dVar34;
            dVar27 = dVar27 + dVar34 * dVar34;
            iVar8 = iVar8 + 1;
          }
          lVar6 = lVar6 + 1;
        }
        dVar26 = dVar28 / (double)iVar8;
        dVar26 = dVar26 * dVar26 + (dVar26 * -2.0 * dVar28 + dVar27) / (double)iVar8;
        if (dVar26 < 0.0) {
          dVar26 = sqrt(dVar26);
        }
        else {
          dVar26 = SQRT(dVar26);
        }
        region_grow(reg->x,reg->y,i,reg,&reg_size,(double *)local_198,i_00,dVar26 + dVar26);
        if (1 < reg_size) {
          region2rect(reg,reg_size,piVar4,(double)local_198._0_8_,local_230,local_220,
                      (rect *)local_1f8);
          dVar26 = (double)reg_size /
                   (SQRT(((double)local_1e8._0_8_ - (double)local_1f8._0_8_) *
                         ((double)local_1e8._0_8_ - (double)local_1f8._0_8_) +
                         ((double)local_1e8._8_8_ - (double)local_1f8._8_8_) *
                         ((double)local_1e8._8_8_ - (double)local_1f8._8_8_)) * local_1d8);
          if (dVar26 < local_110) {
            if (i_00->data == (uchar *)0x0) {
              error("reduce_region_radius: invalid image \'used\'.");
            }
            if (i->data == (double *)0x0) {
              error("reduce_region_radius: invalid image \'angles\'.");
            }
            if (dVar26 < local_110) {
              local_68 = (double)reg->x;
              local_78 = (double)reg->y;
              local_218 = (double)local_198._0_8_;
              auVar31._0_8_ =
                   ((double)local_1f8._8_8_ - local_78) * ((double)local_1f8._8_8_ - local_78);
              auVar31._8_8_ =
                   ((double)local_1e8._8_8_ - local_78) * ((double)local_1e8._8_8_ - local_78);
              auVar29._0_8_ =
                   ((double)local_1f8._0_8_ - local_68) * ((double)local_1f8._0_8_ - local_68) +
                   auVar31._0_8_;
              auVar29._8_8_ =
                   ((double)local_1e8._0_8_ - local_68) * ((double)local_1e8._0_8_ - local_68) +
                   auVar31._8_8_;
              auVar32 = sqrtpd(auVar31,auVar29);
              if (auVar32._0_8_ <= auVar32._8_8_) {
                auVar32._0_8_ = auVar32._8_8_;
              }
              uStack_60 = 0;
              uStack_70 = uVar36;
              while (dVar26 < local_110) {
                auVar33._8_8_ = auVar32._8_8_;
                auVar33._0_8_ = auVar32._0_8_ * 0.75;
                iVar13 = reg_size;
                for (iVar24 = 0; iVar24 < iVar13; iVar24 = iVar24 + 1) {
                  dVar26 = (double)reg[iVar24].x - local_68;
                  dVar27 = (double)reg[iVar24].y - local_78;
                  if (auVar33._0_8_ < SQRT(dVar26 * dVar26 + dVar27 * dVar27)) {
                    i_00->data[reg[iVar24].y * i_00->xsize + reg[iVar24].x] = '\0';
                    reg[iVar24] = reg[(long)reg_size + -1];
                    iVar13 = reg_size + -1;
                    iVar24 = iVar24 + -1;
                    reg_size = iVar13;
                  }
                }
                if (iVar13 < 2) goto LAB_00104c63;
                local_248 = auVar33;
                region2rect(reg,iVar13,piVar4,local_218,local_230,local_220,(rect *)local_1f8);
                auVar32 = local_248;
                dVar26 = (double)reg_size /
                         (SQRT(((double)local_1e8._0_8_ - (double)local_1f8._0_8_) *
                               ((double)local_1e8._0_8_ - (double)local_1f8._0_8_) +
                               ((double)local_1e8._8_8_ - (double)local_1f8._8_8_) *
                               ((double)local_1e8._8_8_ - (double)local_1f8._8_8_)) * local_1d8);
              }
            }
          }
          goto LAB_001045e3;
        }
      }
LAB_00104c63:
      iVar13 = (int)local_228;
      dVar26 = local_230;
    }
    list_p = list_p->next;
  } while( true );
}

Assistant:

ntuple_list LineSegmentDetection( image_double image, double scale,
                                  double sigma_scale, double quant,
                                  double ang_th, double eps, double density_th,
                                  int n_bins, double max_grad,
                                  image_int *region )
{
    ntuple_list out = new_ntuple_list(5);
    image_double scaled_image, angles, modgrad;
    image_char used;
    struct coorlist *list_p;
    void *mem_p;
    struct rect rec;
    struct point *reg;
    int reg_size, min_reg_size, i;
    unsigned int xsize, ysize;
    double rho, reg_angle, prec, p, log_nfa, logNT;
    int ls_count = 0;                   /* line segments are numbered 1,2,3,... */


    /* check parameters */
    if ( image == NULL || image->data == NULL || image->xsize == 0 || image->ysize == 0 )
        error("invalid image input.");
    if ( scale <= 0.0 ) error("'scale' value must be positive.");
    if ( sigma_scale <= 0.0 ) error("'sigma_scale' value must be positive.");
    if ( quant < 0.0 ) error("'quant' value must be positive.");
    if ( ang_th <= 0.0 || ang_th >= 180.0 )
        error("'ang_th' value must be in the range (0,180).");
    if ( density_th < 0.0 || density_th > 1.0 )
        error("'density_th' value must be in the range [0,1].");
    if ( n_bins <= 0 ) error("'n_bins' value must be positive.");
    if ( max_grad <= 0.0 ) error("'max_grad' value must be positive.");


    /* angle tolerance */
    prec = M_PI * ang_th / 180.0;
    p = ang_th / 180.0;
    rho = quant / sin(prec); /* gradient magnitude threshold */


    /* scale image (if necessary) and compute angle at each pixel */
    if ( scale != 1.0 )
    {
        scaled_image = gaussian_sampler( image, scale, sigma_scale );
        angles = ll_angle( scaled_image, rho, &list_p, &mem_p,
                           &modgrad, (unsigned int) n_bins, max_grad );
        free_image_double(scaled_image);
    }
    else
        angles = ll_angle( image, rho, &list_p, &mem_p, &modgrad,
                           (unsigned int) n_bins, max_grad );
    xsize = angles->xsize;
    ysize = angles->ysize;
    logNT = 5.0 * ( log10( (double) xsize ) + log10( (double) ysize ) ) / 2.0;
    min_reg_size = (int) (-logNT / log10(p)); /* minimal number of points in region
                                             that can give a meaningful event */


    /* initialize some structures */
    if ( region != NULL ) /* image to output pixel region number, if asked */
        *region = new_image_int_ini(angles->xsize, angles->ysize, 0);
    used = new_image_char_ini(xsize, ysize, NOTUSED);
    reg = (struct point *) calloc( (size_t) (xsize * ysize), sizeof(struct point) );
    if ( reg == NULL ) error("not enough memory!");


    /* search for line segments */
    for (; list_p != NULL; list_p = list_p->next )
        if ( used->data[ list_p->x + list_p->y * used->xsize ] == NOTUSED &&
                angles->data[ list_p->x + list_p->y * angles->xsize ] != NOTDEF )
            /* there is no risk of double comparison problems here
               because we are only interested in the exact NOTDEF value */
        {
            /* find the region of connected point and ~equal angle */
            region_grow( list_p->x, list_p->y, angles, reg, &reg_size,
                         &reg_angle, used, prec );

            /* reject small regions */
            if ( reg_size < min_reg_size ) continue;

            /* construct rectangular approximation for the region */
            region2rect(reg, reg_size, modgrad, reg_angle, prec, p, &rec);

            /* Check if the rectangle exceeds the minimal density of
               region points. If not, try to improve the region.
               The rectangle will be rejected if the final one does
               not fulfill the minimal density condition.
               This is an addition to the original LSD algorithm published in
               "LSD: A Fast Line Segment Detector with a False Detection Control"
               by R. Grompone von Gioi, J. Jakubowicz, J.M. Morel, and G. Randall.
               The original algorithm is obtained with density_th = 0.0.
             */
            if ( !refine( reg, &reg_size, modgrad, reg_angle,
                          prec, p, &rec, used, angles, density_th ) ) continue;

            /* compute NFA value */
            log_nfa = rect_improve(&rec, angles, logNT, eps);
            if ( log_nfa <= eps ) continue;

            /* A New Line Segment was found! */
            ++ls_count;  /* increase line segment counter */

            /*
               The gradient was computed with a 2x2 mask, its value corresponds to
               points with an offset of (0.5,0.5), that should be added to output.
               The coordinates origin is at the center of pixel (0,0).
             */
            rec.x1 += 0.5; rec.y1 += 0.5;
            rec.x2 += 0.5; rec.y2 += 0.5;

            /* scale the result values if a subsampling was performed */
            if ( scale != 1.0 )
            {
                rec.x1 /= scale; rec.y1 /= scale;
                rec.x2 /= scale; rec.y2 /= scale;
                rec.width /= scale;
            }

            /* add line segment found to output */
            add_5tuple(out, rec.x1, rec.y1, rec.x2, rec.y2, rec.width);

            /* add region number to 'region' image if needed */
            if ( region != NULL )
                for (i = 0; i < reg_size; i++)
                    (*region)->data[reg[i].x + reg[i].y * (*region)->xsize] = ls_count;
        }


    /* free memory */
    free_image_double(angles);
    free_image_double(modgrad);
    free_image_char(used);
    free( (void *) reg );
    free( (void *) mem_p );

    return out;
}